

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

void __thiscall cppcms::archive::archive(archive *this,archive *other)

{
  std::__cxx11::string::string((string *)this,(string *)other);
  this->ptr_ = other->ptr_;
  this->mode_ = other->mode_;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

archive::archive(archive const &other) :
	buffer_(other.buffer_),
	ptr_(other.ptr_),
	mode_(other.mode_)
{
}